

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.hpp
# Opt level: O3

void __thiscall
OpenMD::Field<OpenMD::Vector3<double>_>::~Field(Field<OpenMD::Vector3<double>_> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_StaticAnalyser)._vptr_StaticAnalyser = (_func_int **)&PTR__Field_00336d40;
  std::
  vector<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>_>_>
  ::~vector(&this->field_);
  std::
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ::~vector(&this->dens_);
  SelectionEvaluator::~SelectionEvaluator(&this->evaluator_);
  SelectionManager::~SelectionManager(&this->seleMan_);
  pcVar2 = (this->selectionScript_)._M_dataplus._M_p;
  paVar1 = &(this->selectionScript_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  StaticAnalyser::~StaticAnalyser(&this->super_StaticAnalyser);
  return;
}

Assistant:

virtual ~Field() = default;